

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::SMDImporter::ParseUnsignedInt
          (SMDImporter *this,char *szCurrent,char **szCurrentOut,uint *out)

{
  bool bVar1;
  uint uVar2;
  char *local_20;
  
  local_20 = szCurrent;
  bVar1 = SkipSpaces<char>(&local_20);
  if (bVar1) {
    uVar2 = strtoul10(local_20,szCurrentOut);
    *out = uVar2;
  }
  return bVar1;
}

Assistant:

bool SMDImporter::ParseUnsignedInt(const char* szCurrent, const char** szCurrentOut, unsigned int& out) {
    if(!SkipSpaces(&szCurrent)) {
        return false;
    }

    out = strtoul10(szCurrent,szCurrentOut);
    return true;
}